

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarIndent
          (Scanner *this,uint BlockIndent,uint BlockExitIndent,bool *IsDone)

{
  iterator pcVar1;
  Twine local_48;
  iterator local_30;
  iterator I;
  bool *IsDone_local;
  uint BlockExitIndent_local;
  uint BlockIndent_local;
  Scanner *this_local;
  
  I = IsDone;
  IsDone_local._0_4_ = BlockExitIndent;
  IsDone_local._4_4_ = BlockIndent;
  _BlockExitIndent_local = this;
  while ((this->Column < IsDone_local._4_4_ &&
         (local_30 = skip_s_space(this,this->Current), local_30 != this->Current))) {
    this->Current = local_30;
    this->Column = this->Column + 1;
  }
  pcVar1 = skip_nb_char(this,this->Current);
  if (pcVar1 == this->Current) {
    this_local._7_1_ = true;
  }
  else if ((uint)IsDone_local < this->Column) {
    if (this->Column < IsDone_local._4_4_) {
      if ((this->Current == this->End) || (*this->Current != '#')) {
        Twine::Twine(&local_48,"A text line is less indented than the block scalar");
        setError(this,&local_48,this->Current);
        this_local._7_1_ = false;
      }
      else {
        *I = '\x01';
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    *I = '\x01';
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Scanner::scanBlockScalarIndent(unsigned BlockIndent,
                                    unsigned BlockExitIndent, bool &IsDone) {
  // Skip the indentation.
  while (Column < BlockIndent) {
    auto I = skip_s_space(Current);
    if (I == Current)
      break;
    Current = I;
    ++Column;
  }

  if (skip_nb_char(Current) == Current)
    return true;

  if (Column <= BlockExitIndent) { // End of the block literal.
    IsDone = true;
    return true;
  }

  if (Column < BlockIndent) {
    if (Current != End && *Current == '#') { // Trailing comment.
      IsDone = true;
      return true;
    }
    setError("A text line is less indented than the block scalar", Current);
    return false;
  }
  return true; // A normal text line.
}